

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::IssueMessage(cmake *this,MessageType t,string *text,cmListFileBacktrace *bt,bool force)

{
  bool bVar1;
  MessageType MVar2;
  undefined1 local_200 [8];
  ostringstream msg;
  undefined1 local_70 [4];
  MessageType override;
  cmListFileBacktrace backtrace;
  bool force_local;
  cmListFileBacktrace *bt_local;
  string *text_local;
  MessageType t_local;
  cmake *this_local;
  
  backtrace.Snapshot.Position.Position._7_1_ = force;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_70,bt);
  text_local._4_4_ = t;
  if (((backtrace.Snapshot.Position.Position._7_1_ & 1) == 0) &&
     (MVar2 = ConvertMessageType(this,t), text_local._4_4_ = t, MVar2 != t)) {
    backtrace.Snapshot.Position.Position._7_1_ = 1;
    text_local._4_4_ = MVar2;
  }
  if (((backtrace.Snapshot.Position.Position._7_1_ & 1) != 0) ||
     (bVar1 = IsMessageTypeVisible(this,text_local._4_4_), bVar1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
    bVar1 = PrintMessagePreamble(this,text_local._4_4_,(ostream *)local_200);
    if (bVar1) {
      cmListFileBacktrace::PrintTitle((cmListFileBacktrace *)local_70,(ostream *)local_200);
      printMessageText((ostream *)local_200,text);
      cmListFileBacktrace::PrintCallStack((cmListFileBacktrace *)local_70,(ostream *)local_200);
      displayMessage(text_local._4_4_,(ostringstream *)local_200);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  }
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_70);
  return;
}

Assistant:

void cmake::IssueMessage(cmake::MessageType t, std::string const& text,
                         cmListFileBacktrace const& bt,
                         bool force)
{
  cmListFileBacktrace backtrace = bt;

  if (!force)
    {
    // override the message type, if needed, for warnings and errors
    cmake::MessageType override = this->ConvertMessageType(t);
    if (override != t)
      {
      t = override;
      force = true;
      }
    }

  if (!force && !this->IsMessageTypeVisible(t))
    {
    return;
    }

  std::ostringstream msg;
  if (!this->PrintMessagePreamble(t, msg))
    {
    return;
    }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}